

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SenderStream.cpp
# Opt level: O0

SenderFlow * __thiscall
SenderStream::create_flow(SenderStream *this,string *name,string *bind,int port)

{
  SenderFlow *pSVar1;
  mapped_type *ppSVar2;
  string local_80;
  undefined1 local_5d;
  string local_50;
  SenderFlow *local_30;
  SenderFlow *flow;
  string *psStack_20;
  int port_local;
  string *bind_local;
  string *name_local;
  SenderStream *this_local;
  
  flow._4_4_ = port;
  psStack_20 = bind;
  bind_local = name;
  name_local = (string *)this;
  pSVar1 = (SenderFlow *)operator_new(0x38);
  local_5d = 1;
  std::__cxx11::string::string((string *)&local_50,(string *)bind);
  SenderFlow::SenderFlow(pSVar1,&local_50,flow._4_4_);
  local_5d = 0;
  std::__cxx11::string::~string((string *)&local_50);
  local_30 = pSVar1;
  std::__cxx11::string::string((string *)&local_80,(string *)name);
  SenderFlow::set_name(pSVar1,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  pSVar1 = local_30;
  ppSVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SenderFlow_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SenderFlow_*>_>_>
            ::operator[](&this->m_flows,name);
  *ppSVar2 = pSVar1;
  return local_30;
}

Assistant:

SenderFlow * SenderStream::create_flow(std::string name, std::string bind, int port)
{
    SenderFlow * flow = new SenderFlow(bind, port);
    flow->set_name(name);
    m_flows[name] = flow;
    return flow;
}